

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError PaUtil_GetHostApiRepresentation(PaUtilHostApiRepresentation **hostApi,PaHostApiTypeId type)

{
  int i;
  PaError result;
  PaHostApiTypeId type_local;
  PaUtilHostApiRepresentation **hostApi_local;
  
  if (initializationCount_ == 0) {
    result = -10000;
  }
  else {
    result = -0x26fb;
    for (i = 0; i < hostApisCount_; i = i + 1) {
      if ((hostApis_[i]->info).type == type) {
        *hostApi = hostApis_[i];
        return 0;
      }
    }
  }
  return result;
}

Assistant:

PaError PaUtil_GetHostApiRepresentation( struct PaUtilHostApiRepresentation **hostApi,
        PaHostApiTypeId type )
{
    PaError result;
    int i;

    if( !PA_IS_INITIALISED_ )
    {
        result = paNotInitialized;
    }
    else
    {
        result = paHostApiNotFound;

        for( i=0; i < hostApisCount_; ++i )
        {
            if( hostApis_[i]->info.type == type )
            {
                *hostApi = hostApis_[i];
                result = paNoError;
                break;
            }
        }
    }

    return result;
}